

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O3

void __thiscall
rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
emplace<main::Test&>
          (Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *this,Test *args)

{
  Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *pQVar1;
  ulong uVar2;
  long *plVar3;
  
  LOCK();
  pQVar1 = this + 0x40;
  uVar2 = *(ulong *)pQVar1;
  *(ulong *)pQVar1 = *(ulong *)pQVar1 + 1;
  UNLOCK();
  plVar3 = (long *)((uVar2 % *(ulong *)this) * 0x40 + *(long *)(this + 8));
  do {
  } while ((uVar2 / *(ulong *)this) * 2 != *plVar3);
  *plVar3 = (uVar2 / *(ulong *)this) * 2 + 1;
  return;
}

Assistant:

void emplace(Args &&...args) noexcept {
    static_assert(std::is_nothrow_constructible<T, Args &&...>::value,
                  "T must be nothrow constructible with Args&&...");
    auto const head = head_.fetch_add(1);
    auto &slot = slots_[idx(head)];
    while (turn(head) * 2 != slot.turn.load(std::memory_order_acquire))
      ;
    slot.construct(std::forward<Args>(args)...);
    slot.turn.store(turn(head) * 2 + 1, std::memory_order_release);
  }